

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

void __thiscall amrex::BaseFab<double>::BaseFab(BaseFab<double> *this)

{
  Box *in_RDI;
  
  DataAllocator::DataAllocator((DataAllocator *)((in_RDI->smallend).vect + 2));
  *(undefined ***)(in_RDI->smallend).vect = &PTR__BaseFab_01801870;
  (in_RDI->bigend).vect[1] = 0;
  (in_RDI->bigend).vect[2] = 0;
  Box::Box(in_RDI);
  in_RDI[1].btype.itype = 0;
  in_RDI[2].smallend.vect[0] = 0;
  in_RDI[2].smallend.vect[1] = 0;
  *(undefined1 *)(in_RDI[2].smallend.vect + 2) = 0;
  *(undefined1 *)((long)in_RDI[2].smallend.vect + 9) = 0;
  return;
}

Assistant:

BaseFab<T>::BaseFab () noexcept
{}